

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O1

int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *pNtk)

{
  byte *pbVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  uint uVar5;
  int iVar6;
  uint *__ptr;
  void *pvVar7;
  Vec_Ptr_t *vBoxIns;
  void **ppvVar8;
  uint *__ptr_00;
  char *pcVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint local_48;
  
  uVar12 = pNtk->nObjCounts[8];
  __ptr = (uint *)malloc(0x10);
  uVar5 = 8;
  if (6 < uVar12 - 1) {
    uVar5 = uVar12;
  }
  __ptr[1] = 0;
  *__ptr = uVar5;
  if (uVar5 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc((long)(int)uVar5 * 8);
  }
  *(void **)(__ptr + 2) = pvVar7;
  vBoxIns = (Vec_Ptr_t *)malloc(0x10);
  vBoxIns->nSize = 0;
  vBoxIns->nCap = uVar5;
  if (uVar5 == 0) {
    ppvVar8 = (void **)0x0;
  }
  else {
    ppvVar8 = (void **)malloc((long)(int)uVar5 << 3);
  }
  vBoxIns->pArray = ppvVar8;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[0] = 100;
  __ptr_00[1] = 0;
  pvVar7 = malloc(800);
  *(void **)(__ptr_00 + 2) = pvVar7;
  pVVar10 = pNtk->vBoxes;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar10->pArray[lVar11];
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
        ppvVar8 = pAVar2->pNtk->vObjs->pArray;
        pAVar3 = (Abc_Obj_t *)ppvVar8[*(pAVar2->vFanouts).pArray];
        if (((*(uint *)&pAVar3->field_0x14 & 0xf) != 5) ||
           (pAVar4 = (Abc_Obj_t *)ppvVar8[*(pAVar2->vFanins).pArray],
           (*(uint *)&pAVar4->field_0x14 & 0xf) != 4)) {
          __assert_fail("Abc_ObjIsBo(pBo) && Abc_ObjIsBi(pBi)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x338,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
        }
        uVar12 = vBoxIns->nSize;
        uVar5 = vBoxIns->nCap;
        if (uVar12 == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (vBoxIns->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc(0x80);
            }
            else {
              ppvVar8 = (void **)realloc(vBoxIns->pArray,0x80);
            }
            iVar6 = 0x10;
          }
          else {
            iVar6 = uVar5 * 2;
            if (iVar6 <= (int)uVar5) goto LAB_004767da;
            if (vBoxIns->pArray == (void **)0x0) {
              ppvVar8 = (void **)malloc((ulong)uVar5 << 4);
            }
            else {
              ppvVar8 = (void **)realloc(vBoxIns->pArray,(ulong)uVar5 << 4);
            }
          }
          vBoxIns->pArray = ppvVar8;
          vBoxIns->nCap = iVar6;
        }
LAB_004767da:
        vBoxIns->nSize = uVar12 + 1;
        vBoxIns->pArray[(int)uVar12] = pAVar4;
        Abc_FlowRetime_CopyInitState(pAVar2,pAVar3);
        uVar12 = __ptr[1];
        uVar5 = *__ptr;
        if (uVar12 == uVar5) {
          if ((int)uVar5 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc(0x80);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar14 = 0x10;
          }
          else {
            uVar14 = uVar5 * 2;
            if ((int)uVar14 <= (int)uVar5) goto LAB_0047686f;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc((ulong)uVar5 << 4);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),(ulong)uVar5 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar7;
          *__ptr = uVar14;
        }
LAB_0047686f:
        __ptr[1] = uVar12 + 1;
        *(Abc_Obj_t **)(*(long *)(__ptr + 2) + (long)(int)uVar12 * 8) = pAVar2;
        *(ushort *)(pManMR->pDataArray + (uint)pAVar3->Id) =
             *(ushort *)(pManMR->pDataArray + (uint)pAVar3->Id) | 8;
        Abc_ObjPatchFanin(pAVar3,pAVar2,pAVar4);
        Abc_ObjRemoveFanins(pAVar2);
        pcVar9 = Nm_ManFindNameById(pNtk->pManName,pAVar2->Id);
        if (pcVar9 != (char *)0x0) {
          Nm_ManDeleteIdName(pNtk->pManName,pAVar2->Id);
        }
      }
      lVar11 = lVar11 + 1;
      pVVar10 = pNtk->vBoxes;
    } while (lVar11 < pVVar10->nSize);
  }
  pVVar10 = pNtk->vObjs;
  if (pVVar10->nSize < 1) {
    local_48 = 0;
    uVar12 = 0;
  }
  else {
    lVar11 = 0;
    uVar12 = 0;
    local_48 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar10->pArray[lVar11];
      if (((pAVar2 != (Abc_Obj_t *)0x0) && (uVar5 = *(uint *)&pAVar2->field_0x14 & 0xf, uVar5 != 8))
         && (uVar14 = *(uint *)(pManMR->pDataArray + (uint)pAVar2->Id), (uVar14 >> 8 & 1) == 0)) {
        iVar6 = pManMR->fIsForward;
        if (((ushort)uVar14 & 3) == 1 && iVar6 != 0) {
          __assert_fail("!pManMR->fIsForward || !FTEST(pObj, VISITED_E) || FTEST(pObj, VISITED_R)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                        ,0x351,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
        }
        if (((ushort)uVar14 & 3) == 2) {
          if ((uVar14 & 4) == 0) {
            __assert_fail("FTEST(pObj, FLOW)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                          ,0x353,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
          }
          if (iVar6 == 0) {
            if (uVar5 == 4) goto LAB_004769bb;
          }
          else if ((uVar5 == 5) || (uVar5 == 4 && iVar6 == 0)) {
LAB_004769bb:
            local_48 = local_48 + 1;
          }
          if (0 < (pAVar2->vFanouts).nSize) {
            lVar13 = 0;
            do {
              pAVar3 = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanouts).pArray[lVar13]];
              iVar6 = Abc_FlowRetime_IsAcrossCut(pAVar2,pAVar3);
              if (iVar6 != 0) {
                uVar5 = __ptr_00[1];
                uVar14 = *__ptr_00;
                if (uVar5 == uVar14) {
                  if ((int)uVar14 < 0x10) {
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar7 = malloc(0x80);
                    }
                    else {
                      pvVar7 = realloc(*(void **)(__ptr_00 + 2),0x80);
                    }
                    uVar15 = 0x10;
                  }
                  else {
                    uVar15 = uVar14 * 2;
                    if ((int)uVar15 <= (int)uVar14) goto LAB_00476a68;
                    if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
                      pvVar7 = malloc((ulong)uVar14 << 4);
                    }
                    else {
                      pvVar7 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar14 << 4);
                    }
                  }
                  *(void **)(__ptr_00 + 2) = pvVar7;
                  *__ptr_00 = uVar15;
                }
LAB_00476a68:
                __ptr_00[1] = uVar5 + 1;
                *(Abc_Obj_t **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar5 * 8) = pAVar3;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < (pAVar2->vFanouts).nSize);
          }
          uVar5 = __ptr_00[1];
          if (uVar5 == 0) {
            print_node(pAVar2);
          }
          if ((int)uVar5 < 1) {
            __assert_fail("Vec_PtrSize(vMove) > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                          ,0x364,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
          }
          uVar12 = uVar12 + 1;
          uVar5 = __ptr[1];
          if (uVar5 == 0) {
            __assert_fail("Vec_PtrSize( vFreeRegs )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                          ,0x367,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
          }
          if ((int)uVar5 < 1) goto LAB_00476d47;
          __ptr[1] = uVar5 - 1;
          pAVar3 = *(Abc_Obj_t **)(*(long *)(__ptr + 2) + (ulong)(uVar5 - 1) * 8);
          Abc_ObjAddFanin(pAVar3,pAVar2);
          uVar5 = __ptr_00[1];
          uVar16 = (ulong)uVar5;
          if (uVar16 != 0) {
            do {
              uVar5 = (uint)uVar16;
              if ((int)uVar5 < 1) {
                __ptr_00[1] = uVar5;
                goto LAB_00476d47;
              }
              pAVar4 = *(Abc_Obj_t **)(*(long *)(__ptr_00 + 2) + -8 + uVar16 * 8);
              Abc_ObjPatchFanin(pAVar4,pAVar2,pAVar3);
              if (((*(uint *)&pAVar4->field_0x14 & 0xf) == 4) && ((pAVar4->vFanins).nSize != 1)) {
                __ptr_00[1] = uVar5 - 1;
                __assert_fail("Abc_ObjFaninNum(pNext) == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                              ,0x36e,"int Abc_FlowRetime_ImplementCut(Abc_Ntk_t *)");
              }
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
            uVar5 = 0;
          }
          __ptr_00[1] = uVar5;
        }
      }
      lVar11 = lVar11 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar11 < pVVar10->nSize);
  }
  fPathError = 0;
  if (pManMR->fVerbose != 0) {
    printf("\t\tVerifying latency along all paths...");
  }
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar10->pArray[lVar11];
      if (pAVar2 != (Abc_Obj_t *)0x0) {
        uVar5 = *(uint *)&pAVar2->field_0x14 & 0xf;
        if ((uVar5 == 5) || ((uVar5 == 2 && (pManMR->fIsForward == 0)))) {
          Abc_FlowRetime_VerifyPathLatencies_rec(pAVar2,0);
        }
        if (fPathError != 0) {
          if (0 < (pAVar2->vFanins).nSize) {
            printf("fanin ");
            print_node((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]);
          }
          putchar(10);
          exit(0);
        }
      }
      lVar11 = lVar11 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar11 < pVVar10->nSize);
  }
  if (pManMR->fVerbose != 0) {
    puts(" ok");
  }
  pVVar10 = pNtk->vObjs;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      if (pVVar10->pArray[lVar11] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar10->pArray[lVar11] + 0x14);
        *pbVar1 = *pbVar1 & 0x8f;
      }
      lVar11 = lVar11 + 1;
      pVVar10 = pNtk->vObjs;
    } while (lVar11 < pVVar10->nSize);
  }
  uVar5 = __ptr[1];
  uVar16 = (ulong)uVar5;
  if (uVar16 != 0) {
    do {
      if ((int)(uint)uVar16 < 1) {
        __ptr[1] = (uint)uVar16;
LAB_00476d47:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
      }
      Abc_NtkDeleteObj(*(Abc_Obj_t **)(*(long *)(__ptr + 2) + -8 + uVar16 * 8));
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
    uVar5 = 0;
  }
  __ptr[1] = uVar5;
  Abc_FlowRetime_UpdateLags();
  Abc_FlowRetime_InitState(pNtk);
  Abc_FlowRetime_FixLatchBoxes(pNtk,vBoxIns);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  free(__ptr_00);
  if (vBoxIns->pArray != (void **)0x0) {
    free(vBoxIns->pArray);
    vBoxIns->pArray = (void **)0x0;
  }
  free(vBoxIns);
  if (pManMR->fVerbose != 0) {
    printf("\t\tmin-cut = %d (unmoved = %d)\n",(ulong)uVar12,(ulong)local_48);
  }
  return uVar12;
}

Assistant:

int
Abc_FlowRetime_ImplementCut( Abc_Ntk_t * pNtk ) {
  int i, j, cut = 0, unmoved = 0;
  Abc_Obj_t *pObj, *pReg, *pNext, *pBo = NULL, *pBi = NULL;
  Vec_Ptr_t *vFreeRegs = Vec_PtrAlloc( Abc_NtkLatchNum(pNtk) );
  Vec_Ptr_t *vBoxIns = Vec_PtrAlloc( Abc_NtkLatchNum(pNtk) );
  Vec_Ptr_t *vMove = Vec_PtrAlloc( 100 );

  // remove latches from netlist
  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    pBo = Abc_ObjFanout0(pObj);
    pBi = Abc_ObjFanin0(pObj);
    assert(Abc_ObjIsBo(pBo) && Abc_ObjIsBi(pBi));
    Vec_PtrPush( vBoxIns, pBi );

    // copy initial state values to BO
    Abc_FlowRetime_CopyInitState( pObj, pBo );

    // re-use latch elsewhere
    Vec_PtrPush( vFreeRegs, pObj );
    FSET(pBo, CROSS_BOUNDARY);

    // cut out of netlist
    Abc_ObjPatchFanin( pBo, pObj, pBi );
    Abc_ObjRemoveFanins( pObj );

    // free name
    if (Nm_ManFindNameById(pNtk->pManName, Abc_ObjId(pObj)))
      Nm_ManDeleteIdName( pNtk->pManName, Abc_ObjId(pObj));
  }

  // insert latches into netlist
  Abc_NtkForEachObj( pNtk, pObj, i ) {
    if (Abc_ObjIsLatch( pObj )) continue;
    if (FTEST(pObj, BIAS_NODE)) continue;
    
    // a latch is required on every node that lies across the min-cit
    assert(!pManMR->fIsForward || !FTEST(pObj, VISITED_E) || FTEST(pObj, VISITED_R));
    if (FTEST(pObj, VISITED_R) && !FTEST(pObj, VISITED_E)) {
      assert(FTEST(pObj, FLOW));

      // count size of cut
      cut++;
      if ((pManMR->fIsForward && Abc_ObjIsBo(pObj)) || 
          (!pManMR->fIsForward && Abc_ObjIsBi(pObj)))
        unmoved++;
      
      // only insert latch between fanouts that lie across min-cut
      // some fanout paths may be cut at deeper points
      Abc_ObjForEachFanout( pObj, pNext, j )
        if (Abc_FlowRetime_IsAcrossCut( pObj, pNext ))
          Vec_PtrPush(vMove, pNext);

      // check that move-set is non-zero
      if (Vec_PtrSize(vMove) == 0)
        print_node(pObj);
      assert(Vec_PtrSize(vMove) > 0);
      
      // insert one of re-useable registers
      assert(Vec_PtrSize( vFreeRegs ));
      pReg = (Abc_Obj_t *)Vec_PtrPop( vFreeRegs );
      
      Abc_ObjAddFanin(pReg, pObj);
      while(Vec_PtrSize( vMove )) {
        pNext = (Abc_Obj_t *)Vec_PtrPop( vMove );
        Abc_ObjPatchFanin( pNext, pObj, pReg );
        if (Abc_ObjIsBi(pNext)) assert(Abc_ObjFaninNum(pNext) == 1);

      }
      // APH: broken by bias nodes  if (Abc_ObjIsBi(pObj)) assert(Abc_ObjFaninNum(pObj) == 1);
    }
  }

#if defined(DEBUG_CHECK)        
  Abc_FlowRetime_VerifyPathLatencies( pNtk );
#endif

  // delete remaining latches
  while(Vec_PtrSize( vFreeRegs )) {
    pReg = (Abc_Obj_t *)Vec_PtrPop( vFreeRegs );
    Abc_NtkDeleteObj( pReg );
  }
  
  // update initial states
  Abc_FlowRetime_UpdateLags( );
  Abc_FlowRetime_InitState( pNtk );

  // restore latch boxes
  Abc_FlowRetime_FixLatchBoxes( pNtk, vBoxIns );

  Vec_PtrFree( vFreeRegs );
  Vec_PtrFree( vMove );
  Vec_PtrFree( vBoxIns );

  vprintf("\t\tmin-cut = %d (unmoved = %d)\n", cut, unmoved);
  return cut;
}